

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void VP8YuvToRgba444432_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  char cVar1;
  ulong uVar2;
  ushort uVar3;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i B;
  __m128i G;
  __m128i R;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined4 uVar4;
  undefined6 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [14];
  undefined1 auVar9 [16];
  
  for (uVar2 = 0; uVar2 < 0x20; uVar2 = uVar2 + 8) {
    YUV444ToRGB_SSE2(y + uVar2,u + uVar2,v + uVar2,(__m128i *)&local_48,(__m128i *)&local_58,
                     (__m128i *)&local_68);
    cVar1 = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    auVar11._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11((0 < sStack_5a) *
                                                                         (sStack_5a < 0x100) *
                                                                         (char)sStack_5a -
                                                                         (0xff < sStack_5a),cVar1),
                                                                (0 < sStack_5c) *
                                                                (sStack_5c < 0x100) *
                                                                (char)sStack_5c - (0xff < sStack_5c)
                                                               ),
                                                       (0 < sStack_3c) * (sStack_3c < 0x100) *
                                                       (char)sStack_3c - (0xff < sStack_3c)),
                                              (0 < sStack_5e) * (sStack_5e < 0x100) *
                                              (char)sStack_5e - (0xff < sStack_5e)),
                                     (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e -
                                     (0xff < sStack_3e)),
                            (0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 -
                            (0xff < sStack_60)),
                   CONCAT11((0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 -
                            (0xff < sStack_40),cVar1)) >> 8);
    auVar11[7] = (0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62);
    auVar11[6] = (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 - (0xff < sStack_42);
    auVar11[5] = (0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64);
    auVar11[4] = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    auVar11[3] = (0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66);
    auVar11[2] = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    auVar11[1] = (0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68);
    auVar11[0] = (0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48);
    uVar3 = CONCAT11(0xff,(0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58));
    uVar4 = CONCAT13(0xff,CONCAT12((0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 -
                                   (0xff < sStack_56),uVar3));
    uVar5 = CONCAT15(0xff,CONCAT14((0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 -
                                   (0xff < sStack_54),uVar4));
    uVar6 = CONCAT17(0xff,CONCAT16((0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 -
                                   (0xff < sStack_52),uVar5));
    auVar7._0_10_ =
         CONCAT19(0xff,CONCAT18((0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 -
                                (0xff < sStack_50),uVar6));
    auVar7[10] = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
    auVar7[0xb] = 0xff;
    auVar8[0xc] = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
    auVar8._0_12_ = auVar7;
    auVar8[0xd] = 0xff;
    auVar9[0xe] = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
    auVar9._0_14_ = auVar8;
    auVar9[0xf] = 0xff;
    auVar10._0_2_ = uVar3 >> 4;
    auVar10._2_2_ = (ushort)((uint)uVar4 >> 0x14);
    auVar10._4_2_ = (ushort)((uint6)uVar5 >> 0x24);
    auVar10._6_2_ = (ushort)((ulong)uVar6 >> 0x34);
    auVar10._8_2_ = (ushort)((unkuint10)auVar7._0_10_ >> 0x44);
    auVar10._10_2_ = auVar7._10_2_ >> 4;
    auVar10._12_2_ = auVar8._12_2_ >> 4;
    auVar10._14_2_ = auVar9._14_2_ >> 4;
    *(undefined1 (*) [16])(dst + uVar2 * 2) = auVar10 & _DAT_00142ca0 | auVar11 & _DAT_00142c90;
  }
  return;
}

Assistant:

void VP8YuvToRgba444432_SSE2(const uint8_t* y, const uint8_t* u,
                             const uint8_t* v, uint8_t* dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 16) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4444_SSE2(&R, &G, &B, &kAlpha, dst);
  }
}